

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O1

Ptr addExpress(TokenReader *tokens)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar1;
  _Alloc_hider _Var2;
  element_type *this_00;
  long *plVar3;
  invalid_argument *this_01;
  SimpleASTNode *pSVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  Ptr PVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  uint local_d8;
  Token token;
  Ptr child2;
  Ptr local_90;
  TokenReader *local_80;
  SimpleASTNode *pSStack_78;
  string str;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  Ptr child1;
  
  mulExpress((TokenReader *)&local_48);
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)tokens = local_48;
  *(element_type **)(tokens + 8) =
       child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_text)._M_dataplus._M_p =
           *(int *)&((child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    m_text)._M_dataplus._M_p + 1;
      UNLOCK();
    }
    else {
      *(int *)&((child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_text)._M_dataplus._M_p =
           *(int *)&((child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    m_text)._M_dataplus._M_p + 1;
    }
  }
  local_80 = tokens + 8;
  do {
    TokenReader::peek();
    if ((*(long *)tokens == 0) || ((local_d8 & 0xfffffffe) != 6)) {
      bVar1 = false;
      _Var5._M_pi = extraout_RDX;
    }
    else {
      TokenReader::read();
      local_d8 = (uint)pSStack_78;
      std::__cxx11::string::operator=((string *)&token,(string *)&str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)str._M_dataplus._M_p != &str.field_2) {
        operator_delete(str._M_dataplus._M_p);
      }
      mulExpress((TokenReader *)(token.val.field_2._M_local_buf + 8));
      local_f8._M_dataplus._M_p._0_4_ = 4;
      pSStack_78 = (SimpleASTNode *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<SimpleASTNode,std::allocator<SimpleASTNode>,ASTNodeType_const&,std::__cxx11::string_const&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&str,&pSStack_78,
                 (allocator<SimpleASTNode> *)
                 ((long)&child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7),(ASTNodeType *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&token);
      _Var2 = str._M_dataplus;
      pSVar4 = pSStack_78;
      pSStack_78 = (SimpleASTNode *)0x0;
      str._M_dataplus._M_p = (pointer)0x0;
      this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(tokens + 8);
      *(SimpleASTNode **)tokens = pSVar4;
      *(pointer *)(tokens + 8) = _Var2._M_p;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (str._M_dataplus._M_p != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)str._M_dataplus._M_p);
      }
      this_00 = child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pSVar4 = *(SimpleASTNode **)tokens;
      child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_48;
      if (child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   m_text)._M_dataplus._M_p =
               *(int *)&((child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_text)._M_dataplus._M_p + 1;
          UNLOCK();
        }
        else {
          *(int *)&((child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   m_text)._M_dataplus._M_p =
               *(int *)&((child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_text)._M_dataplus._M_p + 1;
        }
      }
      SimpleASTNode::addChild
                (pSVar4,(Ptr *)&child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
      if (this_00 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
      if (token.val.field_2._8_8_ == 0) {
        std::operator+(&local_f8,"\"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&token);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
        pSStack_78 = (SimpleASTNode *)*plVar3;
        pSVar4 = (SimpleASTNode *)(plVar3 + 2);
        if (pSStack_78 == pSVar4) {
          str._M_string_length = *(size_type *)pSVar4;
          str.field_2._M_allocated_capacity = plVar3[3];
          pSStack_78 = (SimpleASTNode *)&str._M_string_length;
        }
        else {
          str._M_string_length = *(size_type *)pSVar4;
        }
        str._M_dataplus._M_p = (pointer)plVar3[1];
        *plVar3 = (long)pSVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_f8._M_dataplus._M_p._4_4_,local_f8._M_dataplus._M_p._0_4_) !=
            &local_f8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_f8._M_dataplus._M_p._4_4_,local_f8._M_dataplus._M_p._0_4_))
          ;
        }
        this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_01,(char *)pSStack_78);
        __cxa_throw(this_01,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      pSVar4 = *(SimpleASTNode **)tokens;
      local_90.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)token.val.field_2._8_8_;
      local_90.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   m_text)._M_dataplus._M_p =
               *(int *)&((child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_text)._M_dataplus._M_p + 1;
          UNLOCK();
        }
        else {
          *(int *)&((child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   m_text)._M_dataplus._M_p =
               *(int *)&((child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_text)._M_dataplus._M_p + 1;
        }
      }
      SimpleASTNode::addChild(pSVar4,&local_90);
      if ((element_type *)
          local_90.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_90.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_48 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)tokens;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child1,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_80);
      _Var5._M_pi = extraout_RDX_00;
      if (child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        _Var5._M_pi = extraout_RDX_01;
      }
      bVar1 = true;
    }
    if ((size_type *)token._0_8_ != &token.val._M_string_length) {
      operator_delete((void *)token._0_8_);
      _Var5._M_pi = extraout_RDX_02;
    }
    if (!bVar1) {
      if (child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        _Var5._M_pi = extraout_RDX_03;
      }
      PVar6.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var5._M_pi;
      PVar6.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)tokens;
      return (Ptr)PVar6.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>;
    }
  } while( true );
}

Assistant:

static SimpleASTNode::Ptr addExpress(TokenReader& tokens)
{
    SimpleASTNode::Ptr child1 = mulExpress(tokens);
    SimpleASTNode::Ptr node = child1;
    while (true) {
        Token token = tokens.peek();
        if (node != nullptr && !token.isEmpty() && (token.type == TokenType::PLUS_TYPE || token.type == TokenType::MINUS_TYPE)) {
            token = tokens.read();
            SimpleASTNode::Ptr child2 = mulExpress(tokens);
            node = SimpleASTNode::create(ASTNodeType::ADDITIVE_EXP, token.val);
            node->addChild(child1);
            if (child2 != nullptr)
                node->addChild(child2);
            else
            {
                std::string str = "\"" + token.val + "\" Light argument is required!";
                throw std::invalid_argument(str.c_str());
            }
            child1 = node; //key step.
        } else {
            break;
        }
    }
    return node;
}